

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::sse2::BVHNIntersector1<4,_1,_true,_embree::sse2::SubdivPatch1Intersector1>::intersect
               (Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  long lVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  int iVar8;
  ulong uVar9;
  Geometry *pGVar10;
  RTCRayQueryContext *pRVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  undefined8 uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 (*pauVar21) [16];
  int iVar22;
  ulong uVar23;
  long lVar24;
  RayHit *pRVar25;
  int iVar26;
  ulong uVar27;
  undefined1 auVar28 [8];
  undefined1 auVar29 [8];
  undefined4 uVar30;
  ulong unaff_RBX;
  ulong uVar31;
  undefined1 (*pauVar32) [16];
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar82;
  float fVar83;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  float fVar84;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar85;
  float fVar96;
  float fVar97;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  float fVar98;
  float fVar103;
  float fVar104;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar105;
  float fVar116;
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  float fVar117;
  float fVar118;
  float fVar123;
  float fVar124;
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar125;
  float fVar126;
  float fVar127;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar130;
  float fVar131;
  float fVar132;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  float fVar133;
  float fVar136;
  float fVar137;
  float fVar138;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar147;
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  undefined1 auVar146 [16];
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  undefined1 auVar159 [16];
  float fVar164;
  float fVar167;
  float fVar168;
  float fVar169;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  MapUV<embree::sse2::GridSOA::Gather2x3> mapUV;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  float local_1278;
  float fStack_1274;
  float fStack_1270;
  undefined1 local_125c [4];
  undefined1 local_1258 [8];
  float fStack_1250;
  float fStack_124c;
  ulong local_1240;
  undefined8 local_1238;
  float fStack_1230;
  undefined1 auStack_122c [4];
  undefined1 local_1228 [8];
  float fStack_1220;
  float fStack_121c;
  undefined1 local_1218 [8];
  float fStack_1210;
  float fStack_120c;
  undefined1 (*local_1200) [16];
  undefined8 local_11f8;
  float fStack_11f0;
  float fStack_11ec;
  undefined1 local_11e8 [16];
  RTCFilterFunctionNArguments local_11d0;
  uint local_119c;
  undefined1 local_1198 [8];
  float fStack_1190;
  float fStack_118c;
  undefined8 local_1188;
  float fStack_1180;
  float fStack_117c;
  float local_1178;
  float local_1174;
  undefined4 local_1170;
  float local_116c;
  float local_1168;
  uint local_1164;
  undefined4 local_1160;
  uint local_115c;
  uint local_1158;
  float *local_1140;
  ulong local_1138;
  ulong local_1130;
  undefined1 local_1128 [16];
  undefined8 local_1118;
  undefined8 uStack_1110;
  undefined8 local_1108;
  undefined8 uStack_1100;
  float **local_10f8;
  undefined1 local_10e8 [16];
  float local_10d8 [4];
  undefined1 local_10c8 [16];
  float local_10b8 [4];
  undefined1 local_10a8 [8];
  float fStack_10a0;
  float fStack_109c;
  float local_1098 [4];
  undefined1 local_1088 [8];
  float fStack_1080;
  float fStack_107c;
  undefined8 local_1078;
  float fStack_1070;
  float fStack_106c;
  float local_1068;
  float fStack_1064;
  float fStack_1060;
  float fStack_105c;
  float local_1058;
  float fStack_1054;
  float fStack_1050;
  float fStack_104c;
  float local_1048;
  float fStack_1044;
  float fStack_1040;
  float fStack_103c;
  float local_1038;
  float fStack_1034;
  float fStack_1030;
  float fStack_102c;
  float local_1028;
  float fStack_1024;
  float fStack_1020;
  float fStack_101c;
  float local_1018;
  float fStack_1014;
  float fStack_1010;
  float fStack_100c;
  float local_1008;
  float fStack_1004;
  float fStack_1000;
  float fStack_ffc;
  float local_ff8;
  float fStack_ff4;
  float fStack_ff0;
  float fStack_fec;
  float local_fe8;
  float fStack_fe4;
  float fStack_fe0;
  float fStack_fdc;
  float local_fd8;
  float fStack_fd4;
  float fStack_fd0;
  float fStack_fcc;
  float local_fc8;
  float fStack_fc4;
  float fStack_fc0;
  float fStack_fbc;
  float local_fb8;
  float fStack_fb4;
  float fStack_fb0;
  float fStack_fac;
  undefined1 local_fa8 [16];
  float local_f98;
  float fStack_f94;
  float fStack_f90;
  float fStack_f8c;
  uint local_f88;
  uint uStack_f84;
  uint uStack_f80;
  uint uStack_f7c;
  long local_f78;
  undefined4 uStack_f70;
  undefined1 local_f68 [3896];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_f78 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_f70 = 0;
    if (local_f78 != 8) {
      pauVar32 = (undefined1 (*) [16])local_f68;
      fVar132 = (ray->super_RayK<1>).org.field_0.m128[0];
      fVar143 = (ray->super_RayK<1>).org.field_0.m128[1];
      fVar116 = (ray->super_RayK<1>).org.field_0.m128[2];
      aVar7 = (ray->super_RayK<1>).dir.field_0.field_1;
      fVar130 = *(float *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
      fVar142 = 0.0;
      if (0.0 <= fVar130) {
        fVar142 = fVar130;
      }
      fVar130 = (ray->super_RayK<1>).tfar;
      fVar83 = 0.0;
      if (0.0 <= fVar130) {
        fVar83 = fVar130;
      }
      uVar36 = -(uint)(1e-18 <= ABS(aVar7.x));
      uVar38 = -(uint)(1e-18 <= ABS(aVar7.y));
      uVar42 = -(uint)(1e-18 <= ABS(aVar7.z));
      auVar71 = divps(_DAT_01feca10,(undefined1  [16])aVar7);
      fVar144 = (float)(~uVar36 & 0x5d5e0b6b | auVar71._0_4_ & uVar36);
      fVar147 = (float)(~uVar38 & 0x5d5e0b6b | auVar71._4_4_ & uVar38);
      fVar149 = (float)(~uVar42 & 0x5d5e0b6b | auVar71._8_4_ & uVar42);
      fVar152 = fVar144 * 0.99999964;
      fVar154 = fVar147 * 0.99999964;
      fVar156 = fVar149 * 0.99999964;
      fVar144 = fVar144 * 1.0000004;
      fVar147 = fVar147 * 1.0000004;
      fVar149 = fVar149 * 1.0000004;
      uVar31 = (ulong)(fVar152 < 0.0) * 0x10;
      uVar33 = (ulong)(fVar154 < 0.0) << 4 | 0x20;
      uVar35 = (ulong)(fVar156 < 0.0) << 4 | 0x40;
      auVar71._4_4_ = fVar142;
      auVar71._0_4_ = fVar142;
      auVar71._8_4_ = fVar142;
      auVar71._12_4_ = fVar142;
      auVar134._4_4_ = fVar83;
      auVar134._0_4_ = fVar83;
      auVar134._8_4_ = fVar83;
      auVar134._12_4_ = fVar83;
      _local_f88 = mm_lookupmask_ps._240_8_;
      _uStack_f80 = mm_lookupmask_ps._248_8_;
      local_1240 = 0;
      local_f98 = fVar116;
      fStack_f94 = fVar116;
      fStack_f90 = fVar116;
      fStack_f8c = fVar116;
      local_fa8 = auVar71;
      local_fb8 = fVar149;
      fStack_fb4 = fVar149;
      fStack_fb0 = fVar149;
      fStack_fac = fVar149;
      local_fc8 = fVar156;
      fStack_fc4 = fVar156;
      fStack_fc0 = fVar156;
      fStack_fbc = fVar156;
      local_fd8 = fVar132;
      fStack_fd4 = fVar132;
      fStack_fd0 = fVar132;
      fStack_fcc = fVar132;
      local_fe8 = fVar143;
      fStack_fe4 = fVar143;
      fStack_fe0 = fVar143;
      fStack_fdc = fVar143;
      local_1028 = fVar152;
      fStack_1024 = fVar152;
      fStack_1020 = fVar152;
      fStack_101c = fVar152;
      local_1038 = fVar154;
      fStack_1034 = fVar154;
      fStack_1030 = fVar154;
      fStack_102c = fVar154;
      local_1058 = fVar144;
      fStack_1054 = fVar144;
      fStack_1050 = fVar144;
      fStack_104c = fVar144;
      local_1068 = fVar147;
      fStack_1064 = fVar147;
      fStack_1060 = fVar147;
      fStack_105c = fVar147;
      fVar130 = fVar116;
      fVar142 = fVar116;
      fVar83 = fVar116;
      fVar84 = fVar156;
      fVar123 = fVar156;
      fVar137 = fVar156;
      fVar126 = fVar143;
      fVar138 = fVar143;
      fVar82 = fVar143;
      fVar85 = fVar144;
      fVar96 = fVar144;
      fVar97 = fVar144;
      fVar98 = fVar147;
      fVar103 = fVar147;
      fVar104 = fVar147;
      fVar105 = fVar152;
      fVar117 = fVar152;
      fVar118 = fVar152;
      fVar124 = fVar154;
      fVar125 = fVar154;
      fVar127 = fVar154;
      fVar131 = fVar149;
      fVar133 = fVar149;
      fVar136 = fVar149;
      fVar139 = fVar132;
      fVar140 = fVar132;
      fVar141 = fVar132;
      do {
        do {
          do {
            if (pauVar32 == (undefined1 (*) [16])&local_f78) {
              return;
            }
            pauVar21 = pauVar32 + -1;
            pauVar32 = pauVar32 + -1;
          } while ((ray->super_RayK<1>).tfar < *(float *)((long)*pauVar21 + 8));
          uVar23 = *(ulong *)*pauVar32;
          do {
            if ((uVar23 & 8) == 0) {
              pfVar6 = (float *)(uVar23 + 0x20 + uVar31);
              auVar54._0_4_ = (*pfVar6 - fVar132) * fVar152;
              auVar54._4_4_ = (pfVar6[1] - fVar139) * fVar105;
              auVar54._8_4_ = (pfVar6[2] - fVar140) * fVar117;
              auVar54._12_4_ = (pfVar6[3] - fVar141) * fVar118;
              pfVar6 = (float *)(uVar23 + 0x20 + uVar33);
              auVar88._0_4_ = (*pfVar6 - fVar143) * fVar154;
              auVar88._4_4_ = (pfVar6[1] - fVar126) * fVar124;
              auVar88._8_4_ = (pfVar6[2] - fVar138) * fVar125;
              auVar88._12_4_ = (pfVar6[3] - fVar82) * fVar127;
              auVar54 = maxps(auVar54,auVar88);
              pfVar6 = (float *)(uVar23 + 0x20 + uVar35);
              auVar102._0_4_ = (*pfVar6 - fVar116) * fVar156;
              auVar102._4_4_ = (pfVar6[1] - fVar130) * fVar84;
              auVar102._8_4_ = (pfVar6[2] - fVar142) * fVar123;
              auVar102._12_4_ = (pfVar6[3] - fVar83) * fVar137;
              auVar72 = maxps(auVar102,auVar71);
              local_1128 = maxps(auVar54,auVar72);
              pfVar6 = (float *)(uVar23 + 0x20 + (uVar31 ^ 0x10));
              auVar107._0_4_ = (*pfVar6 - fVar132) * fVar144;
              auVar107._4_4_ = (pfVar6[1] - fVar139) * fVar85;
              auVar107._8_4_ = (pfVar6[2] - fVar140) * fVar96;
              auVar107._12_4_ = (pfVar6[3] - fVar141) * fVar97;
              pfVar6 = (float *)(uVar23 + 0x20 + (uVar33 ^ 0x10));
              auVar120._0_4_ = (*pfVar6 - fVar143) * fVar147;
              auVar120._4_4_ = (pfVar6[1] - fVar126) * fVar98;
              auVar120._8_4_ = (pfVar6[2] - fVar138) * fVar103;
              auVar120._12_4_ = (pfVar6[3] - fVar82) * fVar104;
              auVar54 = minps(auVar107,auVar120);
              pfVar6 = (float *)(uVar23 + 0x20 + (uVar35 ^ 0x10));
              auVar86._0_4_ = (*pfVar6 - fVar116) * fVar149;
              auVar86._4_4_ = (pfVar6[1] - fVar130) * fVar131;
              auVar86._8_4_ = (pfVar6[2] - fVar142) * fVar133;
              auVar86._12_4_ = (pfVar6[3] - fVar83) * fVar136;
              auVar72 = minps(auVar86,auVar134);
              auVar54 = minps(auVar54,auVar72);
              auVar72._4_4_ = -(uint)(local_1128._4_4_ <= auVar54._4_4_);
              auVar72._0_4_ = -(uint)(local_1128._0_4_ <= auVar54._0_4_);
              auVar72._8_4_ = -(uint)(local_1128._8_4_ <= auVar54._8_4_);
              auVar72._12_4_ = -(uint)(local_1128._12_4_ <= auVar54._12_4_);
              uVar30 = movmskps((int)unaff_RBX,auVar72);
              unaff_RBX = CONCAT44((int)(unaff_RBX >> 0x20),uVar30);
            }
            if ((uVar23 & 8) == 0) {
              if (unaff_RBX == 0) {
                iVar22 = 4;
              }
              else {
                uVar27 = uVar23 & 0xfffffffffffffff0;
                lVar24 = 0;
                if (unaff_RBX != 0) {
                  for (; (unaff_RBX >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
                  }
                }
                iVar22 = 0;
                iVar26 = 0;
                uVar23 = *(ulong *)(uVar27 + lVar24 * 8);
                uVar34 = unaff_RBX - 1 & unaff_RBX;
                if (uVar34 != 0) {
                  uVar36 = *(uint *)(local_1128 + lVar24 * 4);
                  lVar24 = 0;
                  if (uVar34 != 0) {
                    for (; (uVar34 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
                    }
                  }
                  uVar9 = *(ulong *)(uVar27 + lVar24 * 8);
                  uVar38 = *(uint *)(local_1128 + lVar24 * 4);
                  uVar34 = uVar34 - 1 & uVar34;
                  iVar22 = iVar26;
                  if (uVar34 == 0) {
                    if (uVar36 < uVar38) {
                      *(ulong *)*pauVar32 = uVar9;
                      *(uint *)((long)*pauVar32 + 8) = uVar38;
                      pauVar32 = pauVar32 + 1;
                    }
                    else {
                      *(ulong *)*pauVar32 = uVar23;
                      *(uint *)((long)*pauVar32 + 8) = uVar36;
                      uVar23 = uVar9;
                      pauVar32 = pauVar32 + 1;
                    }
                  }
                  else {
                    auVar55._8_4_ = uVar36;
                    auVar55._0_8_ = uVar23;
                    auVar55._12_4_ = 0;
                    auVar73._8_4_ = uVar38;
                    auVar73._0_8_ = uVar9;
                    auVar73._12_4_ = 0;
                    lVar24 = 0;
                    if (uVar34 != 0) {
                      for (; (uVar34 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
                      }
                    }
                    uVar23 = *(ulong *)(uVar27 + lVar24 * 8);
                    iVar26 = *(int *)(local_1128 + lVar24 * 4);
                    auVar87._8_4_ = iVar26;
                    auVar87._0_8_ = uVar23;
                    auVar87._12_4_ = 0;
                    auVar99._8_4_ = -(uint)((int)uVar36 < (int)uVar38);
                    uVar34 = uVar34 - 1 & uVar34;
                    fVar85 = fStack_1054;
                    fVar96 = fStack_1050;
                    fVar97 = fStack_104c;
                    fVar144 = local_1058;
                    fVar98 = fStack_1064;
                    fVar103 = fStack_1060;
                    fVar104 = fStack_105c;
                    fVar147 = local_1068;
                    if (uVar34 == 0) {
                      auVar99._4_4_ = auVar99._8_4_;
                      auVar99._0_4_ = auVar99._8_4_;
                      auVar99._12_4_ = auVar99._8_4_;
                      auVar54 = auVar55 & auVar99 | ~auVar99 & auVar73;
                      auVar72 = auVar73 & auVar99 | ~auVar99 & auVar55;
                      auVar100._8_4_ = -(uint)(auVar54._8_4_ < iVar26);
                      auVar100._0_8_ = CONCAT44(auVar100._8_4_,auVar100._8_4_);
                      auVar100._12_4_ = auVar100._8_4_;
                      auVar88 = auVar87 & auVar100 | ~auVar100 & auVar54;
                      auVar56._8_4_ = -(uint)(auVar72._8_4_ < auVar88._8_4_);
                      auVar56._4_4_ = auVar56._8_4_;
                      auVar56._0_4_ = auVar56._8_4_;
                      auVar56._12_4_ = auVar56._8_4_;
                      *pauVar32 = ~auVar56 & auVar72 | auVar88 & auVar56;
                      pauVar32[1] = auVar72 & auVar56 | ~auVar56 & auVar88;
                      uVar23 = ~auVar100._0_8_ & uVar23 | auVar54._0_8_ & auVar100._0_8_;
                      pauVar32 = pauVar32 + 2;
                    }
                    else {
                      lVar24 = 0;
                      if (uVar34 != 0) {
                        for (; (uVar34 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
                        }
                      }
                      iVar8 = *(int *)(local_1128 + lVar24 * 4);
                      auVar106._8_4_ = iVar8;
                      auVar106._0_8_ = *(undefined8 *)(uVar27 + lVar24 * 8);
                      auVar106._12_4_ = 0;
                      auVar101._4_4_ = auVar99._8_4_;
                      auVar101._0_4_ = auVar99._8_4_;
                      auVar101._8_4_ = auVar99._8_4_;
                      auVar101._12_4_ = auVar99._8_4_;
                      auVar54 = auVar55 & auVar101 | ~auVar101 & auVar73;
                      auVar72 = auVar73 & auVar101 | ~auVar101 & auVar55;
                      auVar119._0_4_ = -(uint)(iVar26 < iVar8);
                      auVar119._4_4_ = -(uint)(iVar26 < iVar8);
                      auVar119._8_4_ = -(uint)(iVar26 < iVar8);
                      auVar119._12_4_ = -(uint)(iVar26 < iVar8);
                      auVar102 = auVar87 & auVar119 | ~auVar119 & auVar106;
                      auVar120 = ~auVar119 & auVar87 | auVar106 & auVar119;
                      auVar89._8_4_ = -(uint)(auVar72._8_4_ < auVar120._8_4_);
                      auVar89._4_4_ = auVar89._8_4_;
                      auVar89._0_4_ = auVar89._8_4_;
                      auVar89._12_4_ = auVar89._8_4_;
                      auVar107 = auVar72 & auVar89 | ~auVar89 & auVar120;
                      auVar74._8_4_ = -(uint)(auVar54._8_4_ < auVar102._8_4_);
                      auVar74._0_8_ = CONCAT44(auVar74._8_4_,auVar74._8_4_);
                      auVar74._12_4_ = auVar74._8_4_;
                      auVar88 = ~auVar74 & auVar54 | auVar102 & auVar74;
                      auVar57._8_4_ = -(uint)(auVar88._8_4_ < auVar107._8_4_);
                      auVar57._4_4_ = auVar57._8_4_;
                      auVar57._0_4_ = auVar57._8_4_;
                      auVar57._12_4_ = auVar57._8_4_;
                      *pauVar32 = ~auVar89 & auVar72 | auVar120 & auVar89;
                      pauVar32[1] = ~auVar57 & auVar88 | auVar107 & auVar57;
                      pauVar32[2] = auVar88 & auVar57 | ~auVar57 & auVar107;
                      uVar23 = auVar54._0_8_ & auVar74._0_8_ | ~auVar74._0_8_ & auVar102._0_8_;
                      pauVar32 = pauVar32 + 3;
                      fVar152 = local_1028;
                      fVar105 = fStack_1024;
                      fVar117 = fStack_1020;
                      fVar118 = fStack_101c;
                      fVar154 = local_1038;
                      fVar124 = fStack_1034;
                      fVar125 = fStack_1030;
                      fVar127 = fStack_102c;
                    }
                  }
                }
              }
            }
            else {
              iVar22 = 6;
            }
          } while (iVar22 == 0);
        } while (iVar22 != 6);
        if (((uint)uVar23 & 0xf) == 8) {
          uVar27 = (ulong)*(uint *)(local_1240 + 0xc);
          auVar29 = (undefined1  [8])(*(uint *)(local_1240 + 0x24) + local_1240 + (uVar23 >> 4) * 4)
          ;
          fVar130 = *(float *)((long)auVar29 + 0x30);
          pfVar6 = (float *)((long)auVar29 + 0x2c + uVar27 * 4);
          fVar142 = pfVar6[1];
          fVar132 = *(float *)((long)auVar29 + 0x34);
          fVar143 = pfVar6[2];
          if (uVar27 == 2) {
            fVar132 = fVar130;
            fVar143 = fVar142;
          }
          uVar23 = (ulong)*(uint *)(local_1240 + 0x14);
          lVar24 = (long)auVar29 + uVar23 * 4;
          fVar116 = *(float *)(lVar24 + 0x30);
          pfVar1 = (float *)(lVar24 + 0x2c) + uVar27;
          fVar83 = pfVar1[1];
          fVar156 = *(float *)(lVar24 + 0x34);
          fVar84 = pfVar1[2];
          if (uVar27 == 2) {
            fVar156 = fVar116;
            fVar84 = fVar83;
          }
          lVar2 = (long)auVar29 + uVar23 * 8;
          fVar123 = *(float *)(lVar2 + 0x30);
          pfVar3 = (float *)(lVar2 + 0x2c) + uVar27;
          fVar137 = pfVar3[1];
          fVar126 = *(float *)(lVar2 + 0x34);
          fVar138 = pfVar3[2];
          if (uVar27 == 2) {
            fVar126 = fVar123;
            fVar138 = fVar137;
          }
          fVar82 = (ray->super_RayK<1>).org.field_0.m128[0];
          fVar85 = (ray->super_RayK<1>).org.field_0.m128[1];
          fVar96 = (ray->super_RayK<1>).org.field_0.m128[2];
          uVar18 = *(undefined8 *)&(ray->super_RayK<1>).dir.field_0;
          local_1198._0_4_ = *(float *)((long)auVar29 + 0x2c) - fVar82;
          local_1198._4_4_ = *pfVar6 - fVar82;
          fStack_1190 = fVar130 - fVar82;
          fStack_118c = fVar142 - fVar82;
          local_ff8 = *(float *)(lVar24 + 0x2c) - fVar85;
          fStack_ff4 = *pfVar1 - fVar85;
          fStack_ff0 = fVar116 - fVar85;
          fStack_fec = fVar83 - fVar85;
          local_11f8._0_4_ = *(float *)(lVar2 + 0x2c) - fVar96;
          local_11f8._4_4_ = *pfVar3 - fVar96;
          fStack_11f0 = fVar123 - fVar96;
          fStack_11ec = fVar137 - fVar96;
          fVar154 = fVar130 - fVar82;
          fVar130 = fVar130 - fVar82;
          fVar131 = fVar132 - fVar82;
          fVar132 = fVar132 - fVar82;
          fVar105 = fVar116 - fVar85;
          fVar116 = fVar116 - fVar85;
          fStack_1230 = fVar156 - fVar85;
          auStack_122c = (undefined1  [4])(fVar156 - fVar85);
          fVar117 = fVar123 - fVar96;
          fVar123 = fVar123 - fVar96;
          fVar124 = fVar126 - fVar96;
          fVar126 = fVar126 - fVar96;
          fVar140 = *pfVar6 - fVar82;
          fVar141 = fVar142 - fVar82;
          fVar142 = fVar142 - fVar82;
          fVar143 = fVar143 - fVar82;
          fVar156 = *pfVar1 - fVar85;
          fVar82 = fVar83 - fVar85;
          fVar83 = fVar83 - fVar85;
          fVar84 = fVar84 - fVar85;
          fVar133 = *pfVar3 - fVar96;
          fVar136 = fVar137 - fVar96;
          fVar137 = fVar137 - fVar96;
          fVar138 = fVar138 - fVar96;
          local_1228._0_4_ = fVar140 - (float)local_1198._0_4_;
          local_1228._4_4_ = fVar141 - (float)local_1198._4_4_;
          fStack_1220 = fVar142 - fStack_1190;
          fStack_121c = fVar143 - fStack_118c;
          fVar153 = fVar156 - local_ff8;
          fVar155 = fVar82 - fStack_ff4;
          fStack_1180 = fVar83 - fStack_ff0;
          fStack_117c = fVar84 - fStack_fec;
          fVar157 = fVar133 - (float)local_11f8;
          fVar160 = fVar136 - local_11f8._4_4_;
          fStack_1070 = fVar137 - fStack_11f0;
          fStack_106c = fVar138 - fStack_11ec;
          local_1078 = (RTCRayQueryContext *)CONCAT44(fVar160,fVar157);
          local_1278 = (float)uVar18;
          fStack_1274 = (float)((ulong)uVar18 >> 0x20);
          fStack_1270 = (float)*(undefined8 *)((long)&(ray->super_RayK<1>).dir.field_0 + 8);
          local_1188 = CONCAT44(fVar155,fVar153);
          fVar118 = local_ff8 - fVar105;
          fVar152 = fStack_ff4 - fVar116;
          fVar125 = fStack_ff0 - fStack_1230;
          fVar127 = fStack_fec - (float)auStack_122c;
          local_1218._0_4_ =
               (fVar153 * (fVar133 + (float)local_11f8) - fVar157 * (fVar156 + local_ff8)) *
               local_1278 +
               (fVar157 * (fVar140 + (float)local_1198._0_4_) -
               (fVar133 + (float)local_11f8) * (float)local_1228._0_4_) * fStack_1274 +
               ((fVar156 + local_ff8) * (float)local_1228._0_4_ -
               (fVar140 + (float)local_1198._0_4_) * fVar153) * fStack_1270;
          local_1218._4_4_ =
               (fVar155 * (fVar136 + local_11f8._4_4_) - fVar160 * (fVar82 + fStack_ff4)) *
               local_1278 +
               (fVar160 * (fVar141 + (float)local_1198._4_4_) -
               (fVar136 + local_11f8._4_4_) * (float)local_1228._4_4_) * fStack_1274 +
               ((fVar82 + fStack_ff4) * (float)local_1228._4_4_ -
               (fVar141 + (float)local_1198._4_4_) * fVar155) * fStack_1270;
          fVar149 = (fStack_1180 * (fVar137 + fStack_11f0) - fStack_1070 * (fVar83 + fStack_ff0)) *
                    local_1278 +
                    (fStack_1070 * (fVar142 + fStack_1190) - (fVar137 + fStack_11f0) * fStack_1220)
                    * fStack_1274 +
                    ((fVar83 + fStack_ff0) * fStack_1220 - (fVar142 + fStack_1190) * fStack_1180) *
                    fStack_1270;
          fVar139 = (fStack_117c * (fVar138 + fStack_11ec) - fStack_106c * (fVar84 + fStack_fec)) *
                    local_1278 +
                    (fStack_106c * (fVar143 + fStack_118c) - (fVar138 + fStack_11ec) * fStack_121c)
                    * fStack_1274 +
                    ((fVar84 + fStack_fec) * fStack_121c - (fVar143 + fStack_118c) * fStack_117c) *
                    fStack_1270;
          fStack_1210 = fVar149;
          fStack_120c = fVar139;
          fVar98 = (float)local_11f8 - fVar117;
          fVar103 = local_11f8._4_4_ - fVar123;
          fVar104 = fStack_11f0 - fVar124;
          fVar147 = fStack_11ec - fVar126;
          fVar85 = (float)local_1198._0_4_ - fVar154;
          fVar96 = (float)local_1198._4_4_ - fVar130;
          fVar97 = fStack_1190 - fVar131;
          fVar144 = fStack_118c - fVar132;
          local_1008 = (fVar118 * ((float)local_11f8 + fVar117) - fVar98 * (local_ff8 + fVar105)) *
                       local_1278 +
                       (fVar98 * ((float)local_1198._0_4_ + fVar154) -
                       ((float)local_11f8 + fVar117) * fVar85) * fStack_1274 +
                       ((local_ff8 + fVar105) * fVar85 -
                       ((float)local_1198._0_4_ + fVar154) * fVar118) * fStack_1270;
          fStack_1004 = (fVar152 * (local_11f8._4_4_ + fVar123) - fVar103 * (fStack_ff4 + fVar116))
                        * local_1278 +
                        (fVar103 * ((float)local_1198._4_4_ + fVar130) -
                        (local_11f8._4_4_ + fVar123) * fVar96) * fStack_1274 +
                        ((fStack_ff4 + fVar116) * fVar96 -
                        ((float)local_1198._4_4_ + fVar130) * fVar152) * fStack_1270;
          fStack_1000 = (fVar125 * (fStack_11f0 + fVar124) - fVar104 * (fStack_ff0 + fStack_1230)) *
                        local_1278 +
                        (fVar104 * (fStack_1190 + fVar131) - (fStack_11f0 + fVar124) * fVar97) *
                        fStack_1274 +
                        ((fStack_ff0 + fStack_1230) * fVar97 - (fStack_1190 + fVar131) * fVar125) *
                        fStack_1270;
          fStack_ffc = (fVar127 * (fStack_11ec + fVar126) -
                       fVar147 * (fStack_fec + (float)auStack_122c)) * local_1278 +
                       (fVar147 * (fStack_118c + fVar132) - (fStack_11ec + fVar126) * fVar144) *
                       fStack_1274 +
                       ((fStack_fec + (float)auStack_122c) * fVar144 -
                       (fStack_118c + fVar132) * fVar127) * fStack_1270;
          fVar164 = fVar154 - fVar140;
          fVar167 = fVar130 - fVar141;
          fVar168 = fVar131 - fVar142;
          fVar169 = fVar132 - fVar143;
          fVar145 = fVar105 - fVar156;
          fVar148 = fVar116 - fVar82;
          fVar150 = fStack_1230 - fVar83;
          fVar151 = (float)auStack_122c - fVar84;
          fVar158 = fVar117 - fVar133;
          fVar161 = fVar123 - fVar136;
          fVar162 = fVar124 - fVar137;
          fVar163 = fVar126 - fVar138;
          local_1258._4_4_ = fStack_1274;
          local_1258._0_4_ = fStack_1274;
          fStack_1250 = fStack_1274;
          fStack_124c = fStack_1274;
          auVar50._0_4_ =
               (fVar145 * (fVar133 + fVar117) - fVar158 * (fVar156 + fVar105)) * local_1278 +
               (fVar158 * (fVar140 + fVar154) - (fVar133 + fVar117) * fVar164) * fStack_1274 +
               ((fVar156 + fVar105) * fVar164 - (fVar140 + fVar154) * fVar145) * fStack_1270;
          auVar50._4_4_ =
               (fVar148 * (fVar136 + fVar123) - fVar161 * (fVar82 + fVar116)) * local_1278 +
               (fVar161 * (fVar141 + fVar130) - (fVar136 + fVar123) * fVar167) * fStack_1274 +
               ((fVar82 + fVar116) * fVar167 - (fVar141 + fVar130) * fVar148) * fStack_1270;
          auVar50._8_4_ =
               (fVar150 * (fVar137 + fVar124) - fVar162 * (fVar83 + fStack_1230)) * local_1278 +
               (fVar162 * (fVar142 + fVar131) - (fVar137 + fVar124) * fVar168) * fStack_1274 +
               ((fVar83 + fStack_1230) * fVar168 - (fVar142 + fVar131) * fVar150) * fStack_1270;
          auVar50._12_4_ =
               (fVar151 * (fVar138 + fVar126) - fVar163 * (fVar84 + (float)auStack_122c)) *
               local_1278 +
               (fVar163 * (fVar143 + fVar132) - (fVar138 + fVar126) * fVar169) * fStack_1274 +
               ((fVar84 + (float)auStack_122c) * fVar169 - (fVar143 + fVar132) * fVar151) *
               fStack_1270;
          local_1018 = (float)local_1218._0_4_ + local_1008 + auVar50._0_4_;
          fStack_1014 = (float)local_1218._4_4_ + fStack_1004 + auVar50._4_4_;
          fStack_1010 = fVar149 + fStack_1000 + auVar50._8_4_;
          fStack_100c = fVar139 + fStack_ffc + auVar50._12_4_;
          auVar12._4_4_ = fStack_1004;
          auVar12._0_4_ = local_1008;
          auVar12._8_4_ = fStack_1000;
          auVar12._12_4_ = fStack_ffc;
          auVar71 = minps(_local_1218,auVar12);
          auVar71 = minps(auVar71,auVar50);
          auVar13._4_4_ = fStack_1004;
          auVar13._0_4_ = local_1008;
          auVar13._8_4_ = fStack_1000;
          auVar13._12_4_ = fStack_ffc;
          auVar134 = maxps(_local_1218,auVar13);
          auVar134 = maxps(auVar134,auVar50);
          local_1130 = CONCAT44(0,*(uint *)(local_1240 + 0x10));
          local_1140 = (float *)((long)auVar29 + 0x2c + uVar23 * 0xc);
          local_1138 = uVar27;
          uVar36 = *(uint *)(local_1240 + 0x18);
          local_1238 = (ulong)uVar36;
          local_1048 = *(float *)(local_1240 + 0x1c);
          local_10f8 = &local_1140;
          auVar135._0_4_ =
               -(uint)(auVar134._0_4_ <= ABS(local_1018) * 1.1920929e-07 ||
                      -(ABS(local_1018) * 1.1920929e-07) <= auVar71._0_4_) & local_f88;
          auVar135._4_4_ =
               -(uint)(auVar134._4_4_ <= ABS(fStack_1014) * 1.1920929e-07 ||
                      -(ABS(fStack_1014) * 1.1920929e-07) <= auVar71._4_4_) & uStack_f84;
          auVar135._8_4_ =
               -(uint)(auVar134._8_4_ <= ABS(fStack_1010) * 1.1920929e-07 ||
                      -(ABS(fStack_1010) * 1.1920929e-07) <= auVar71._8_4_) & uStack_f80;
          auVar135._12_4_ =
               -(uint)(auVar134._12_4_ <= ABS(fStack_100c) * 1.1920929e-07 ||
                      -(ABS(fStack_100c) * 1.1920929e-07) <= auVar71._12_4_) & uStack_f7c;
          iVar22 = movmskps((int)&local_1140,auVar135);
          auVar28 = (undefined1  [8])local_1130;
          if (iVar22 != 0) {
            uVar38 = -(uint)(ABS(fVar98 * fVar145) <= ABS(fVar157 * fVar118));
            uVar39 = -(uint)(ABS(fVar103 * fVar148) <= ABS(fVar160 * fVar152));
            uVar43 = -(uint)(ABS(fVar104 * fVar150) <= ABS(fStack_1070 * fVar125));
            uVar46 = -(uint)(ABS(fVar147 * fVar151) <= ABS(fStack_106c * fVar127));
            uVar42 = -(uint)(ABS(fVar85 * fVar158) <= ABS((float)local_1228._0_4_ * fVar98));
            uVar40 = -(uint)(ABS(fVar96 * fVar161) <= ABS((float)local_1228._4_4_ * fVar103));
            uVar44 = -(uint)(ABS(fVar97 * fVar162) <= ABS(fStack_1220 * fVar104));
            uVar47 = -(uint)(ABS(fVar144 * fVar163) <= ABS(fStack_121c * fVar147));
            uVar37 = -(uint)(ABS(fVar118 * fVar164) <= ABS(fVar153 * fVar85));
            uVar41 = -(uint)(ABS(fVar152 * fVar167) <= ABS(fVar155 * fVar96));
            uVar45 = -(uint)(ABS(fVar125 * fVar168) <= ABS(fStack_1180 * fVar97));
            uVar48 = -(uint)(ABS(fVar127 * fVar169) <= ABS(fStack_117c * fVar144));
            auVar121._0_4_ = (uint)(fVar118 * fVar158 - fVar98 * fVar145) & uVar38;
            auVar121._4_4_ = (uint)(fVar152 * fVar161 - fVar103 * fVar148) & uVar39;
            auVar121._8_4_ = (uint)(fVar125 * fVar162 - fVar104 * fVar150) & uVar43;
            auVar121._12_4_ = (uint)(fVar127 * fVar163 - fVar147 * fVar151) & uVar46;
            auVar128._0_4_ = ~uVar38 & (uint)(fVar153 * fVar98 - fVar157 * fVar118);
            auVar128._4_4_ = ~uVar39 & (uint)(fVar155 * fVar103 - fVar160 * fVar152);
            auVar128._8_4_ = ~uVar43 & (uint)(fStack_1180 * fVar104 - fStack_1070 * fVar125);
            auVar128._12_4_ = ~uVar46 & (uint)(fStack_117c * fVar147 - fStack_106c * fVar127);
            _local_10a8 = auVar128 | auVar121;
            local_1098[0] =
                 (float)(~uVar42 & (uint)(fVar157 * fVar85 - (float)local_1228._0_4_ * fVar98) |
                        (uint)(fVar98 * fVar164 - fVar85 * fVar158) & uVar42);
            local_1098[1] =
                 (float)(~uVar40 & (uint)(fVar160 * fVar96 - (float)local_1228._4_4_ * fVar103) |
                        (uint)(fVar103 * fVar167 - fVar96 * fVar161) & uVar40);
            local_1098[2] =
                 (float)(~uVar44 & (uint)(fStack_1070 * fVar97 - fStack_1220 * fVar104) |
                        (uint)(fVar104 * fVar168 - fVar97 * fVar162) & uVar44);
            local_1098[3] =
                 (float)(~uVar47 & (uint)(fStack_106c * fVar144 - fStack_121c * fVar147) |
                        (uint)(fVar147 * fVar169 - fVar144 * fVar163) & uVar47);
            local_1088._0_4_ =
                 ~uVar37 & (uint)((float)local_1228._0_4_ * fVar118 - fVar153 * fVar85) |
                 (uint)(fVar85 * fVar145 - fVar118 * fVar164) & uVar37;
            local_1088._4_4_ =
                 ~uVar41 & (uint)((float)local_1228._4_4_ * fVar152 - fVar155 * fVar96) |
                 (uint)(fVar96 * fVar148 - fVar152 * fVar167) & uVar41;
            fStack_1080 = (float)(~uVar45 & (uint)(fStack_1220 * fVar125 - fStack_1180 * fVar97) |
                                 (uint)(fVar97 * fVar150 - fVar125 * fVar168) & uVar45);
            fStack_107c = (float)(~uVar48 & (uint)(fStack_121c * fVar127 - fStack_117c * fVar144) |
                                 (uint)(fVar144 * fVar151 - fVar127 * fVar169) & uVar48);
            fVar130 = local_1278 * local_10a8._0_4_ +
                      fStack_1274 * local_1098[0] + fStack_1270 * (float)local_1088._0_4_;
            fVar142 = local_1278 * local_10a8._4_4_ +
                      fStack_1274 * local_1098[1] + fStack_1270 * (float)local_1088._4_4_;
            fVar132 = local_1278 * local_10a8._8_4_ +
                      fStack_1274 * local_1098[2] + fStack_1270 * fStack_1080;
            fVar143 = local_1278 * local_10a8._12_4_ +
                      fStack_1274 * local_1098[3] + fStack_1270 * fStack_107c;
            auVar108._0_4_ = fVar130 + fVar130;
            auVar108._4_4_ = fVar142 + fVar142;
            auVar108._8_4_ = fVar132 + fVar132;
            auVar108._12_4_ = fVar143 + fVar143;
            auVar58._0_4_ = local_ff8 * local_1098[0] + (float)local_11f8 * (float)local_1088._0_4_;
            auVar58._4_4_ = fStack_ff4 * local_1098[1] + local_11f8._4_4_ * (float)local_1088._4_4_;
            auVar58._8_4_ = fStack_ff0 * local_1098[2] + fStack_11f0 * fStack_1080;
            auVar58._12_4_ = fStack_fec * local_1098[3] + fStack_11ec * fStack_107c;
            fVar116 = (float)local_1198._0_4_ * local_10a8._0_4_ + auVar58._0_4_;
            fVar83 = (float)local_1198._4_4_ * local_10a8._4_4_ + auVar58._4_4_;
            fVar156 = fStack_1190 * local_10a8._8_4_ + auVar58._8_4_;
            fVar84 = fStack_118c * local_10a8._12_4_ + auVar58._12_4_;
            auVar71 = rcpps(auVar58,auVar108);
            fVar130 = auVar71._0_4_;
            fVar142 = auVar71._4_4_;
            fVar132 = auVar71._8_4_;
            fVar143 = auVar71._12_4_;
            auVar90._0_4_ = fVar116 + fVar116;
            auVar90._4_4_ = fVar83 + fVar83;
            auVar90._8_4_ = fVar156 + fVar156;
            auVar90._12_4_ = fVar84 + fVar84;
            local_10b8[0] = ((1.0 - auVar108._0_4_ * fVar130) * fVar130 + fVar130) * auVar90._0_4_;
            local_10b8[1] = ((1.0 - auVar108._4_4_ * fVar142) * fVar142 + fVar142) * auVar90._4_4_;
            local_10b8[2] = ((1.0 - auVar108._8_4_ * fVar132) * fVar132 + fVar132) * auVar90._8_4_;
            local_10b8[3] = ((1.0 - auVar108._12_4_ * fVar143) * fVar143 + fVar143) * auVar90._12_4_
            ;
            fVar130 = (ray->super_RayK<1>).tfar;
            fVar142 = (ray->super_RayK<1>).org.field_0.m128[3];
            auVar109._0_4_ =
                 (int)((uint)(auVar108._0_4_ != 0.0 &&
                             (local_10b8[0] <= fVar130 && fVar142 <= local_10b8[0])) * -0x80000000)
                 >> 0x1f;
            auVar109._4_4_ =
                 (int)((uint)(auVar108._4_4_ != 0.0 &&
                             (local_10b8[1] <= fVar130 && fVar142 <= local_10b8[1])) * -0x80000000)
                 >> 0x1f;
            auVar109._8_4_ =
                 (int)((uint)(auVar108._8_4_ != 0.0 &&
                             (local_10b8[2] <= fVar130 && fVar142 <= local_10b8[2])) * -0x80000000)
                 >> 0x1f;
            auVar109._12_4_ =
                 (int)((uint)(auVar108._12_4_ != 0.0 &&
                             (local_10b8[3] <= fVar130 && fVar142 <= local_10b8[3])) * -0x80000000)
                 >> 0x1f;
            auVar110 = auVar109 & auVar135;
            iVar22 = movmskps(iVar22,auVar110);
            if (iVar22 != 0) {
              local_1128._8_4_ = fStack_1210;
              local_1128._12_4_ = fStack_120c;
              local_1128._0_8_ = local_1218;
              local_1118 = CONCAT44(fStack_1004,local_1008);
              uStack_1110 = CONCAT44(fStack_ffc,fStack_1000);
              local_1108 = CONCAT44(fStack_1014,local_1018);
              uStack_1100 = CONCAT44(fStack_100c,fStack_1010);
              local_10f8 = &local_1140;
              local_10e8 = auVar110;
              pGVar10 = (context->scene->geometries).items[uVar36].ptr;
              if ((pGVar10->mask & (ray->super_RayK<1>).mask) != 0) {
                local_11e8 = auVar110;
                auVar19._8_8_ = CONCAT44(fStack_100c,fStack_1010);
                auVar19._0_8_ = CONCAT44(fStack_1014,local_1018);
                auVar71 = rcpps(auVar90,auVar19);
                fVar130 = auVar71._0_4_;
                fVar142 = auVar71._4_4_;
                fVar132 = auVar71._8_4_;
                fVar143 = auVar71._12_4_;
                fVar130 = (float)(-(uint)(1e-18 <= ABS(local_1018)) &
                                 (uint)(((float)DAT_01feca10 - local_1018 * fVar130) * fVar130 +
                                       fVar130));
                fVar142 = (float)(-(uint)(1e-18 <= ABS(fStack_1014)) &
                                 (uint)((DAT_01feca10._4_4_ - fStack_1014 * fVar142) * fVar142 +
                                       fVar142));
                fVar132 = (float)(-(uint)(1e-18 <= ABS(fStack_1010)) &
                                 (uint)((DAT_01feca10._8_4_ - fStack_1010 * fVar132) * fVar132 +
                                       fVar132));
                fVar143 = (float)(-(uint)(1e-18 <= ABS(fStack_100c)) &
                                 (uint)((DAT_01feca10._12_4_ - fStack_100c * fVar143) * fVar143 +
                                       fVar143));
                auVar75._0_4_ = (float)local_1218._0_4_ * fVar130;
                auVar75._4_4_ = (float)local_1218._4_4_ * fVar142;
                auVar75._8_4_ = fVar149 * fVar132;
                auVar75._12_4_ = fVar139 * fVar143;
                auVar134 = minps(auVar75,_DAT_01feca10);
                auVar59._0_4_ = fVar130 * local_1008;
                auVar59._4_4_ = fVar142 * fStack_1004;
                auVar59._8_4_ = fVar132 * fStack_1000;
                auVar59._12_4_ = fVar143 * fStack_ffc;
                auVar71 = minps(auVar59,_DAT_01feca10);
                fVar130 = local_1140[1];
                pfVar6 = local_1140 + uVar27;
                fVar142 = *pfVar6;
                fVar132 = pfVar6[1];
                fVar143 = local_1140[2];
                fVar116 = pfVar6[2];
                if (uVar27 == 2) {
                  fVar143 = fVar130;
                  fVar116 = fVar132;
                }
                local_1218 = (undefined1  [8])local_1130;
                fVar137 = auVar134._0_4_;
                fVar126 = auVar134._4_4_;
                fVar138 = auVar134._8_4_;
                fVar82 = auVar134._12_4_;
                fVar83 = auVar71._0_4_;
                fVar156 = auVar71._4_4_;
                fVar84 = auVar71._8_4_;
                fVar123 = auVar71._12_4_;
                fVar85 = (1.0 - fVar137) - fVar83;
                fVar96 = (1.0 - fVar126) - fVar156;
                fVar97 = (1.0 - fVar138) - fVar84;
                fVar144 = (1.0 - fVar82) - fVar123;
                local_10c8._0_4_ =
                     fVar85 * (float)((uint)*local_1140 >> 0x10) * 0.00012207031 +
                     (float)((uint)fVar142 >> 0x10) * 0.00012207031 * fVar83 +
                     (float)((uint)fVar130 >> 0x10) * 0.00012207031 * fVar137;
                local_10c8._4_4_ =
                     fVar96 * (float)((uint)fVar142 >> 0x10) * 0.00012207031 +
                     (float)((uint)fVar132 >> 0x10) * 0.00012207031 * fVar156 +
                     (float)((uint)fVar130 >> 0x10) * 0.00012207031 * fVar126;
                local_10c8._8_4_ =
                     fVar97 * (float)((uint)fVar130 >> 0x10) * 0.00012207031 +
                     (float)((uint)fVar132 >> 0x10) * 0.00012207031 * fVar84 +
                     (float)((uint)fVar143 >> 0x10) * 0.00012207031 * fVar138;
                local_10c8._12_4_ =
                     fVar144 * (float)((uint)fVar132 >> 0x10) * 0.00012207031 +
                     (float)((uint)fVar116 >> 0x10) * 0.00012207031 * fVar123 +
                     (float)((uint)fVar143 >> 0x10) * 0.00012207031 * fVar82;
                local_10d8[1] =
                     (float)((uint)fVar142 & 0xffff) * 0.00012207031 * fVar96 +
                     (float)((uint)fVar132 & 0xffff) * 0.00012207031 * fVar156 +
                     (float)((uint)fVar130 & 0xffff) * 0.00012207031 * fVar126;
                local_10d8[0] =
                     (float)((uint)*local_1140 & 0xffff) * 0.00012207031 * fVar85 +
                     (float)((uint)fVar142 & 0xffff) * 0.00012207031 * fVar83 +
                     (float)((uint)fVar130 & 0xffff) * 0.00012207031 * fVar137;
                local_10d8[2] =
                     (float)((uint)fVar130 & 0xffff) * 0.00012207031 * fVar97 +
                     (float)((uint)fVar132 & 0xffff) * 0.00012207031 * fVar84 +
                     (float)((uint)fVar143 & 0xffff) * 0.00012207031 * fVar138;
                local_10d8[3] =
                     (float)((uint)fVar132 & 0xffff) * 0.00012207031 * fVar144 +
                     (float)((uint)fVar116 & 0xffff) * 0.00012207031 * fVar123 +
                     (float)((uint)fVar143 & 0xffff) * 0.00012207031 * fVar82;
                auVar114._4_4_ = local_10b8[1];
                auVar114._0_4_ = local_10b8[0];
                auVar114._8_4_ = local_10b8[2];
                auVar114._12_4_ = local_10b8[3];
                auVar134 = ~auVar110 & _DAT_01feb9f0 | auVar114 & auVar110;
                auVar91._4_4_ = auVar134._0_4_;
                auVar91._0_4_ = auVar134._4_4_;
                auVar91._8_4_ = auVar134._12_4_;
                auVar91._12_4_ = auVar134._8_4_;
                auVar71 = minps(auVar91,auVar134);
                auVar60._0_8_ = auVar71._8_8_;
                auVar60._8_4_ = auVar71._0_4_;
                auVar60._12_4_ = auVar71._4_4_;
                auVar71 = minps(auVar60,auVar71);
                auVar61._0_8_ =
                     CONCAT44(-(uint)(auVar71._4_4_ == auVar134._4_4_) & auVar110._4_4_,
                              -(uint)(auVar71._0_4_ == auVar134._0_4_) & auVar110._0_4_);
                auVar61._8_4_ = -(uint)(auVar71._8_4_ == auVar134._8_4_) & auVar110._8_4_;
                auVar61._12_4_ = -(uint)(auVar71._12_4_ == auVar134._12_4_) & auVar110._12_4_;
                iVar22 = movmskps(*(uint *)(local_1240 + 0xc),auVar61);
                if (iVar22 != 0) {
                  auVar110._8_4_ = auVar61._8_4_;
                  auVar110._0_8_ = auVar61._0_8_;
                  auVar110._12_4_ = auVar61._12_4_;
                }
                uVar38 = movmskps(iVar22,auVar110);
                lVar24 = 0;
                if (uVar38 != 0) {
                  for (; (uVar38 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
                  }
                }
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  fVar130 = local_10d8[lVar24];
                  fVar142 = local_10b8[lVar24 + -4];
                  fVar132 = local_1098[lVar24 + -4];
                  fVar143 = local_1098[lVar24];
                  fVar116 = *(float *)(local_1088 + lVar24 * 4);
                  (ray->super_RayK<1>).tfar = local_10b8[lVar24];
                  (ray->Ng).field_0.field_0.x = fVar132;
                  (ray->Ng).field_0.field_0.y = fVar143;
                  (ray->Ng).field_0.field_0.z = fVar116;
                  ray->u = fVar130;
                  ray->v = fVar142;
                  ray->primID = (uint)local_1048;
                  ray->geomID = uVar36;
                  pRVar11 = context->user;
                  ray->instID[0] = pRVar11->instID[0];
                  ray->instPrimID[0] = pRVar11->instPrimID[0];
                }
                else {
                  local_1228 = (undefined1  [8])context->args;
                  local_1078 = context->user;
                  local_1188 = uVar27;
                  local_1258 = auVar29;
                  _local_1198 = auVar114;
                  local_1200 = pauVar32;
                  do {
                    local_116c = local_10d8[lVar24];
                    local_1168 = local_10b8[lVar24 + -4];
                    local_11f8._0_4_ = (ray->super_RayK<1>).tfar;
                    (ray->super_RayK<1>).tfar = local_10b8[lVar24];
                    local_1178 = local_1098[lVar24 + -4];
                    local_1174 = local_1098[lVar24];
                    local_1170 = *(undefined4 *)(local_1088 + lVar24 * 4);
                    local_1164 = (uint)local_1048;
                    local_1160 = (int)local_1238;
                    local_115c = local_1078->instID[0];
                    local_1158 = local_1078->instPrimID[0];
                    local_125c = (undefined1  [4])0xffffffff;
                    local_11d0.valid = (int *)local_125c;
                    local_11d0.geometryUserPtr = pGVar10->userPtr;
                    local_11d0.context = local_1078;
                    local_11d0.ray = (RTCRayN *)ray;
                    local_11d0.hit = (RTCHitN *)&local_1178;
                    local_11d0.N = 1;
                    if (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00dfecbf:
                      if (*(Device **)((long)local_1228 + 0x10) != (Device *)0x0) {
                        auVar28 = local_1228;
                        if (((*(byte *)local_1228 & 2) != 0) ||
                           (auVar28 = (undefined1  [8])pGVar10,
                           ((pGVar10->field_8).field_0x2 & 0x40) != 0)) {
                          (*(code *)*(Device **)((long)local_1228 + 0x10))(&local_11d0);
                          auVar29 = local_1258;
                          pauVar32 = local_1200;
                          uVar27 = local_1188;
                          auVar114 = _local_1198;
                        }
                        if ((((RayK<1> *)local_11d0.valid)->org).field_0.m128[0] == 0.0)
                        goto LAB_00dfed85;
                      }
                      (((Vec3f *)((long)local_11d0.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_11d0.hit;
                      (((Vec3f *)((long)local_11d0.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_11d0.hit + 4);
                      (((Vec3f *)((long)local_11d0.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_11d0.hit + 8);
                      *(float *)((long)local_11d0.ray + 0x3c) = *(float *)(local_11d0.hit + 0xc);
                      *(float *)((long)local_11d0.ray + 0x40) = *(float *)(local_11d0.hit + 0x10);
                      *(float *)((long)local_11d0.ray + 0x44) = *(float *)(local_11d0.hit + 0x14);
                      *(float *)((long)local_11d0.ray + 0x48) = *(float *)(local_11d0.hit + 0x18);
                      *(float *)((long)local_11d0.ray + 0x4c) = *(float *)(local_11d0.hit + 0x1c);
                      auVar28 = (undefined1  [8])(ulong)(uint)*(float *)(local_11d0.hit + 0x20);
                      *(float *)((long)local_11d0.ray + 0x50) = *(float *)(local_11d0.hit + 0x20);
                      pRVar25 = (RayHit *)local_11d0.ray;
                      auVar29 = local_1258;
                    }
                    else {
                      auVar28 = (undefined1  [8])pGVar10;
                      (*pGVar10->intersectionFilterN)(&local_11d0);
                      auVar29 = local_1258;
                      pauVar32 = local_1200;
                      uVar27 = local_1188;
                      auVar114 = _local_1198;
                      if ((((RayK<1> *)local_11d0.valid)->org).field_0.m128[0] != 0.0)
                      goto LAB_00dfecbf;
LAB_00dfed85:
                      (ray->super_RayK<1>).tfar = (float)local_11f8;
                      pRVar25 = (RayHit *)local_11d0.valid;
                    }
                    *(undefined4 *)(local_11e8 + lVar24 * 4) = 0;
                    fVar130 = (ray->super_RayK<1>).tfar;
                    auVar52._0_4_ = -(uint)(auVar114._0_4_ <= fVar130) & local_11e8._0_4_;
                    auVar52._4_4_ = -(uint)(auVar114._4_4_ <= fVar130) & local_11e8._4_4_;
                    auVar52._8_4_ = -(uint)(auVar114._8_4_ <= fVar130) & local_11e8._8_4_;
                    auVar52._12_4_ = -(uint)(auVar114._12_4_ <= fVar130) & local_11e8._12_4_;
                    local_11e8 = auVar52;
                    iVar22 = movmskps((int)pRVar25,auVar52);
                    if (iVar22 != 0) {
                      auVar65._0_4_ = auVar52._0_4_ & (uint)auVar114._0_4_;
                      auVar65._4_4_ = auVar52._4_4_ & (uint)auVar114._4_4_;
                      auVar65._8_4_ = auVar52._8_4_ & (uint)auVar114._8_4_;
                      auVar65._12_4_ = auVar52._12_4_ & (uint)auVar114._12_4_;
                      auVar80._0_8_ = CONCAT44(~auVar52._4_4_,~auVar52._0_4_) & 0x7f8000007f800000;
                      auVar80._8_4_ = ~auVar52._8_4_ & 0x7f800000;
                      auVar80._12_4_ = ~auVar52._12_4_ & 0x7f800000;
                      auVar80 = auVar80 | auVar65;
                      auVar94._4_4_ = auVar80._0_4_;
                      auVar94._0_4_ = auVar80._4_4_;
                      auVar94._8_4_ = auVar80._12_4_;
                      auVar94._12_4_ = auVar80._8_4_;
                      auVar71 = minps(auVar94,auVar80);
                      auVar66._0_8_ = auVar71._8_8_;
                      auVar66._8_4_ = auVar71._0_4_;
                      auVar66._12_4_ = auVar71._4_4_;
                      auVar71 = minps(auVar66,auVar71);
                      auVar67._0_8_ =
                           CONCAT44(-(uint)(auVar71._4_4_ == auVar80._4_4_) & auVar52._4_4_,
                                    -(uint)(auVar71._0_4_ == auVar80._0_4_) & auVar52._0_4_);
                      auVar67._8_4_ = -(uint)(auVar71._8_4_ == auVar80._8_4_) & auVar52._8_4_;
                      auVar67._12_4_ = -(uint)(auVar71._12_4_ == auVar80._12_4_) & auVar52._12_4_;
                      iVar26 = movmskps(SUB84(auVar28,0),auVar67);
                      if (iVar26 != 0) {
                        auVar52._8_4_ = auVar67._8_4_;
                        auVar52._0_8_ = auVar67._0_8_;
                        auVar52._12_4_ = auVar67._12_4_;
                      }
                      uVar30 = movmskps(iVar26,auVar52);
                      uVar23 = CONCAT44((int)((ulong)auVar28 >> 0x20),uVar30);
                      lVar24 = 0;
                      if (uVar23 != 0) {
                        for (; (uVar23 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
                        }
                      }
                    }
                    auVar28 = local_1218;
                  } while ((char)iVar22 != '\0');
                }
              }
            }
          }
          if (2 < SUB84(auVar28,0)) {
            lVar24 = (long)auVar29 + uVar27 * 4;
            local_1140 = (float *)(lVar24 + 0x2c);
            fVar130 = *(float *)(lVar24 + 0x30);
            pfVar6 = local_1140 + uVar27;
            fVar142 = pfVar6[1];
            fVar132 = *(float *)(lVar24 + 0x34);
            fVar143 = pfVar6[2];
            if (uVar27 == 2) {
              fVar132 = fVar130;
              fVar143 = fVar142;
            }
            uVar23 = (ulong)*(uint *)(local_1240 + 0x14);
            pfVar1 = local_1140 + uVar23;
            fVar116 = pfVar1[1];
            pfVar3 = pfVar1 + uVar27;
            fVar83 = pfVar3[1];
            fVar156 = pfVar1[2];
            fVar84 = pfVar3[2];
            if (uVar27 == 2) {
              fVar156 = fVar116;
              fVar84 = fVar83;
            }
            pfVar4 = local_1140 + uVar23 * 2;
            fVar123 = pfVar4[1];
            pfVar5 = pfVar4 + uVar27;
            fVar137 = pfVar5[1];
            fVar126 = pfVar4[2];
            fVar138 = pfVar5[2];
            if (uVar27 == 2) {
              fVar126 = fVar123;
              fVar138 = fVar137;
            }
            fVar82 = (ray->super_RayK<1>).org.field_0.m128[0];
            fVar85 = (ray->super_RayK<1>).org.field_0.m128[1];
            fVar96 = (ray->super_RayK<1>).org.field_0.m128[2];
            fVar97 = (ray->super_RayK<1>).dir.field_0.m128[0];
            local_1238._0_4_ = (ray->super_RayK<1>).dir.field_0.m128[1];
            fVar144 = (ray->super_RayK<1>).dir.field_0.m128[2];
            local_ff8 = *local_1140 - fVar82;
            fStack_ff4 = *pfVar6 - fVar82;
            fStack_ff0 = fVar130 - fVar82;
            fStack_fec = fVar142 - fVar82;
            local_1198._0_4_ = *pfVar1 - fVar85;
            local_1198._4_4_ = *pfVar3 - fVar85;
            fStack_1190 = fVar116 - fVar85;
            fStack_118c = fVar83 - fVar85;
            fVar153 = *pfVar4 - fVar96;
            fVar157 = *pfVar5 - fVar96;
            fStack_11f0 = fVar123 - fVar96;
            fStack_11ec = fVar137 - fVar96;
            fVar147 = fVar130 - fVar82;
            fVar130 = fVar130 - fVar82;
            fVar105 = fVar132 - fVar82;
            fVar132 = fVar132 - fVar82;
            fVar149 = fVar116 - fVar85;
            fVar116 = fVar116 - fVar85;
            fVar139 = fVar156 - fVar85;
            fVar156 = fVar156 - fVar85;
            fVar117 = fVar123 - fVar96;
            fVar123 = fVar123 - fVar96;
            fVar127 = fVar126 - fVar96;
            fVar126 = fVar126 - fVar96;
            fVar150 = *pfVar6 - fVar82;
            fVar151 = fVar142 - fVar82;
            fVar142 = fVar142 - fVar82;
            fVar143 = fVar143 - fVar82;
            fVar82 = *pfVar3 - fVar85;
            fVar98 = fVar83 - fVar85;
            fVar83 = fVar83 - fVar85;
            fVar84 = fVar84 - fVar85;
            fVar140 = *pfVar5 - fVar96;
            fVar141 = fVar137 - fVar96;
            fVar137 = fVar137 - fVar96;
            fVar138 = fVar138 - fVar96;
            fVar118 = fVar150 - local_ff8;
            fVar124 = fVar151 - fStack_ff4;
            fVar154 = fVar142 - fStack_ff0;
            fVar133 = fVar143 - fStack_fec;
            fVar160 = fVar82 - (float)local_1198._0_4_;
            fVar161 = fVar98 - (float)local_1198._4_4_;
            fStack_1180 = fVar83 - fStack_1190;
            fStack_117c = fVar84 - fStack_118c;
            fVar145 = fVar140 - fVar153;
            fVar148 = fVar141 - fVar157;
            fStack_1070 = fVar137 - fStack_11f0;
            fStack_106c = fVar138 - fStack_11ec;
            local_1078 = (RTCRayQueryContext *)CONCAT44(fVar148,fVar145);
            local_1188 = CONCAT44(fVar161,fVar160);
            local_1228._4_4_ = fVar124;
            local_1228._0_4_ = fVar118;
            fStack_1220 = fVar154;
            fStack_121c = fVar133;
            local_1018 = (float)local_1198._0_4_ - fVar149;
            fStack_1014 = (float)local_1198._4_4_ - fVar116;
            fStack_1010 = fStack_1190 - fVar139;
            fStack_100c = fStack_118c - fVar156;
            fVar168 = (fVar160 * (fVar140 + fVar153) - fVar145 * (fVar82 + (float)local_1198._0_4_))
                      * fVar97 +
                      (fVar145 * (fVar150 + local_ff8) - (fVar140 + fVar153) * fVar118) *
                      (float)local_1238 +
                      ((fVar82 + (float)local_1198._0_4_) * fVar118 -
                      (fVar150 + local_ff8) * fVar160) * fVar144;
            fVar169 = (fVar161 * (fVar141 + fVar157) - fVar148 * (fVar98 + (float)local_1198._4_4_))
                      * fVar97 +
                      (fVar148 * (fVar151 + fStack_ff4) - (fVar141 + fVar157) * fVar124) *
                      (float)local_1238 +
                      ((fVar98 + (float)local_1198._4_4_) * fVar124 -
                      (fVar151 + fStack_ff4) * fVar161) * fVar144;
            auVar165._0_8_ = CONCAT44(fVar169,fVar168);
            auVar165._8_4_ =
                 (fStack_1180 * (fVar137 + fStack_11f0) - fStack_1070 * (fVar83 + fStack_1190)) *
                 fVar97 + (fStack_1070 * (fVar142 + fStack_ff0) - (fVar137 + fStack_11f0) * fVar154)
                          * (float)local_1238 +
                          ((fVar83 + fStack_1190) * fVar154 - (fVar142 + fStack_ff0) * fStack_1180)
                          * fVar144;
            auVar165._12_4_ =
                 (fStack_117c * (fVar138 + fStack_11ec) - fStack_106c * (fVar84 + fStack_118c)) *
                 fVar97 + (fStack_106c * (fVar143 + fStack_fec) - (fVar138 + fStack_11ec) * fVar133)
                          * (float)local_1238 +
                          ((fVar84 + fStack_118c) * fVar133 - (fVar143 + fStack_fec) * fStack_117c)
                          * fVar144;
            local_1008 = fVar153 - fVar117;
            fStack_1004 = fVar157 - fVar123;
            fStack_1000 = fStack_11f0 - fVar127;
            fStack_ffc = fStack_11ec - fVar126;
            local_11f8 = CONCAT44(fVar157,fVar153);
            fVar152 = local_ff8 - fVar147;
            fVar125 = fStack_ff4 - fVar130;
            fVar131 = fStack_ff0 - fVar105;
            fVar136 = fStack_fec - fVar132;
            fVar155 = (local_1018 * (fVar153 + fVar117) -
                      local_1008 * ((float)local_1198._0_4_ + fVar149)) * fVar97 +
                      (local_1008 * (local_ff8 + fVar147) - (fVar153 + fVar117) * fVar152) *
                      (float)local_1238 +
                      (((float)local_1198._0_4_ + fVar149) * fVar152 -
                      (local_ff8 + fVar147) * local_1018) * fVar144;
            fVar158 = (fStack_1014 * (fVar157 + fVar123) -
                      fStack_1004 * ((float)local_1198._4_4_ + fVar116)) * fVar97 +
                      (fStack_1004 * (fStack_ff4 + fVar130) - (fVar157 + fVar123) * fVar125) *
                      (float)local_1238 +
                      (((float)local_1198._4_4_ + fVar116) * fVar125 -
                      (fStack_ff4 + fVar130) * fStack_1014) * fVar144;
            auVar146._0_8_ = CONCAT44(fVar158,fVar155);
            auVar146._8_4_ =
                 (fStack_1010 * (fStack_11f0 + fVar127) - fStack_1000 * (fStack_1190 + fVar139)) *
                 fVar97 + (fStack_1000 * (fStack_ff0 + fVar105) - (fStack_11f0 + fVar127) * fVar131)
                          * (float)local_1238 +
                          ((fStack_1190 + fVar139) * fVar131 - (fStack_ff0 + fVar105) * fStack_1010)
                          * fVar144;
            auVar146._12_4_ =
                 (fStack_100c * (fStack_11ec + fVar126) - fStack_ffc * (fStack_118c + fVar156)) *
                 fVar97 + (fStack_ffc * (fStack_fec + fVar132) - (fStack_11ec + fVar126) * fVar136)
                          * (float)local_1238 +
                          ((fStack_118c + fVar156) * fVar136 - (fStack_fec + fVar132) * fStack_100c)
                          * fVar144;
            fVar162 = fVar147 - fVar150;
            fVar163 = fVar130 - fVar151;
            fVar164 = fVar105 - fVar142;
            fVar167 = fVar132 - fVar143;
            local_1228._0_4_ = fVar149 - fVar82;
            local_1228._4_4_ = fVar116 - fVar98;
            fStack_1220 = fVar139 - fVar83;
            fStack_121c = fVar156 - fVar84;
            fVar85 = fVar117 - fVar140;
            fVar96 = fVar123 - fVar141;
            fVar103 = fVar127 - fVar137;
            fVar104 = fVar126 - fVar138;
            local_1238._4_4_ = (float)local_1238;
            fStack_1230 = (float)local_1238;
            auStack_122c = (undefined1  [4])(float)local_1238;
            auVar51._0_4_ =
                 ((float)local_1228._0_4_ * (fVar140 + fVar117) - fVar85 * (fVar82 + fVar149)) *
                 fVar97 + (fVar85 * (fVar150 + fVar147) - (fVar140 + fVar117) * fVar162) *
                          (float)local_1238 +
                          ((fVar82 + fVar149) * fVar162 -
                          (fVar150 + fVar147) * (float)local_1228._0_4_) * fVar144;
            auVar51._4_4_ =
                 ((float)local_1228._4_4_ * (fVar141 + fVar123) - fVar96 * (fVar98 + fVar116)) *
                 fVar97 + (fVar96 * (fVar151 + fVar130) - (fVar141 + fVar123) * fVar163) *
                          (float)local_1238 +
                          ((fVar98 + fVar116) * fVar163 -
                          (fVar151 + fVar130) * (float)local_1228._4_4_) * fVar144;
            auVar51._8_4_ =
                 (fStack_1220 * (fVar137 + fVar127) - fVar103 * (fVar83 + fVar139)) * fVar97 +
                 (fVar103 * (fVar142 + fVar105) - (fVar137 + fVar127) * fVar164) * (float)local_1238
                 + ((fVar83 + fVar139) * fVar164 - (fVar142 + fVar105) * fStack_1220) * fVar144;
            auVar51._12_4_ =
                 (fStack_121c * (fVar138 + fVar126) - fVar104 * (fVar84 + fVar156)) * fVar97 +
                 (fVar104 * (fVar143 + fVar132) - (fVar138 + fVar126) * fVar167) * (float)local_1238
                 + ((fVar84 + fVar156) * fVar167 - (fVar143 + fVar132) * fStack_121c) * fVar144;
            local_1048 = fVar168 + fVar155 + auVar51._0_4_;
            fStack_1044 = fVar169 + fVar158 + auVar51._4_4_;
            fStack_1040 = auVar165._8_4_ + auVar146._8_4_ + auVar51._8_4_;
            fStack_103c = auVar165._12_4_ + auVar146._12_4_ + auVar51._12_4_;
            auVar129._8_4_ = auVar165._8_4_;
            auVar129._0_8_ = auVar165._0_8_;
            auVar129._12_4_ = auVar165._12_4_;
            auVar71 = minps(auVar129,auVar146);
            auVar134 = minps(auVar71,auVar51);
            _local_1218 = auVar165;
            auVar76._8_4_ = auVar165._8_4_;
            auVar76._0_8_ = auVar165._0_8_;
            auVar76._12_4_ = auVar165._12_4_;
            _local_1258 = auVar146;
            auVar71 = maxps(auVar76,auVar146);
            auVar71 = maxps(auVar71,auVar51);
            local_1140 = local_1140 + uVar23 * 3;
            local_1138 = uVar27;
            local_1130 = (ulong)auVar28;
            uVar36 = *(uint *)(local_1240 + 0x18);
            uVar23 = (ulong)uVar36;
            uVar38 = *(uint *)(local_1240 + 0x1c);
            local_10f8 = &local_1140;
            auVar77._0_8_ =
                 CONCAT44(-(uint)(auVar71._4_4_ <= ABS(fStack_1044) * 1.1920929e-07 ||
                                 -(ABS(fStack_1044) * 1.1920929e-07) <= auVar134._4_4_) & uStack_f84
                          ,-(uint)(auVar71._0_4_ <= ABS(local_1048) * 1.1920929e-07 ||
                                  -(ABS(local_1048) * 1.1920929e-07) <= auVar134._0_4_) & local_f88)
            ;
            auVar77._8_4_ =
                 -(uint)(auVar71._8_4_ <= ABS(fStack_1040) * 1.1920929e-07 ||
                        -(ABS(fStack_1040) * 1.1920929e-07) <= auVar134._8_4_) & uStack_f80;
            auVar77._12_4_ =
                 -(uint)(auVar71._12_4_ <= ABS(fStack_103c) * 1.1920929e-07 ||
                        -(ABS(fStack_103c) * 1.1920929e-07) <= auVar134._12_4_) & uStack_f7c;
            iVar22 = movmskps((int)&local_1140,auVar77);
            if (iVar22 != 0) {
              auVar159._8_4_ = auVar77._8_4_;
              auVar159._0_8_ = auVar77._0_8_;
              auVar159._12_4_ = auVar77._12_4_;
              uVar42 = -(uint)(ABS(local_1008 * (float)local_1228._0_4_) <=
                              ABS(fVar145 * local_1018));
              uVar40 = -(uint)(ABS(fStack_1004 * (float)local_1228._4_4_) <=
                              ABS(fVar148 * fStack_1014));
              uVar44 = -(uint)(ABS(fStack_1000 * fStack_1220) <= ABS(fStack_1070 * fStack_1010));
              uVar47 = -(uint)(ABS(fStack_ffc * fStack_121c) <= ABS(fStack_106c * fStack_100c));
              uVar37 = -(uint)(ABS(fVar152 * fVar85) <= ABS(fVar118 * local_1008));
              uVar41 = -(uint)(ABS(fVar125 * fVar96) <= ABS(fVar124 * fStack_1004));
              uVar45 = -(uint)(ABS(fVar131 * fVar103) <= ABS(fVar154 * fStack_1000));
              uVar48 = -(uint)(ABS(fVar136 * fVar104) <= ABS(fVar133 * fStack_ffc));
              uVar39 = -(uint)(ABS(local_1018 * fVar162) <= ABS(fVar160 * fVar152));
              uVar43 = -(uint)(ABS(fStack_1014 * fVar163) <= ABS(fVar161 * fVar125));
              uVar46 = -(uint)(ABS(fStack_1010 * fVar164) <= ABS(fStack_1180 * fVar131));
              uVar49 = -(uint)(ABS(fStack_100c * fVar167) <= ABS(fStack_117c * fVar136));
              local_10a8._0_4_ =
                   ~uVar42 & (uint)(fVar160 * local_1008 - fVar145 * local_1018) |
                   (uint)(local_1018 * fVar85 - local_1008 * (float)local_1228._0_4_) & uVar42;
              local_10a8._4_4_ =
                   ~uVar40 & (uint)(fVar161 * fStack_1004 - fVar148 * fStack_1014) |
                   (uint)(fStack_1014 * fVar96 - fStack_1004 * (float)local_1228._4_4_) & uVar40;
              fStack_10a0 = (float)(~uVar44 & (uint)(fStack_1180 * fStack_1000 -
                                                    fStack_1070 * fStack_1010) |
                                   (uint)(fStack_1010 * fVar103 - fStack_1000 * fStack_1220) &
                                   uVar44);
              fStack_109c = (float)(~uVar47 & (uint)(fStack_117c * fStack_ffc -
                                                    fStack_106c * fStack_100c) |
                                   (uint)(fStack_100c * fVar104 - fStack_ffc * fStack_121c) & uVar47
                                   );
              local_1098[0] =
                   (float)(~uVar37 & (uint)(fVar145 * fVar152 - fVar118 * local_1008) |
                          (uint)(local_1008 * fVar162 - fVar152 * fVar85) & uVar37);
              local_1098[1] =
                   (float)(~uVar41 & (uint)(fVar148 * fVar125 - fVar124 * fStack_1004) |
                          (uint)(fStack_1004 * fVar163 - fVar125 * fVar96) & uVar41);
              local_1098[2] =
                   (float)(~uVar45 & (uint)(fStack_1070 * fVar131 - fVar154 * fStack_1000) |
                          (uint)(fStack_1000 * fVar164 - fVar131 * fVar103) & uVar45);
              local_1098[3] =
                   (float)(~uVar48 & (uint)(fStack_106c * fVar136 - fVar133 * fStack_ffc) |
                          (uint)(fStack_ffc * fVar167 - fVar136 * fVar104) & uVar48);
              auVar122._0_4_ =
                   (uint)(fVar152 * (float)local_1228._0_4_ - local_1018 * fVar162) & uVar39;
              auVar122._4_4_ =
                   (uint)(fVar125 * (float)local_1228._4_4_ - fStack_1014 * fVar163) & uVar43;
              auVar122._8_4_ = (uint)(fVar131 * fStack_1220 - fStack_1010 * fVar164) & uVar46;
              auVar122._12_4_ = (uint)(fVar136 * fStack_121c - fStack_100c * fVar167) & uVar49;
              auVar166._0_4_ = ~uVar39 & (uint)(fVar118 * local_1018 - fVar160 * fVar152);
              auVar166._4_4_ = ~uVar43 & (uint)(fVar124 * fStack_1014 - fVar161 * fVar125);
              auVar166._8_4_ = ~uVar46 & (uint)(fVar154 * fStack_1010 - fStack_1180 * fVar131);
              auVar166._12_4_ = ~uVar49 & (uint)(fVar133 * fStack_100c - fStack_117c * fVar136);
              _local_1088 = auVar166 | auVar122;
              fVar130 = fVar97 * (float)local_10a8._0_4_ +
                        (float)local_1238 * local_1098[0] + fVar144 * local_1088._0_4_;
              fVar142 = fVar97 * (float)local_10a8._4_4_ +
                        (float)local_1238 * local_1098[1] + fVar144 * local_1088._4_4_;
              fVar132 = fVar97 * fStack_10a0 +
                        (float)local_1238 * local_1098[2] + fVar144 * local_1088._8_4_;
              fVar143 = fVar97 * fStack_109c +
                        (float)local_1238 * local_1098[3] + fVar144 * local_1088._12_4_;
              auVar111._0_4_ = fVar130 + fVar130;
              auVar111._4_4_ = fVar142 + fVar142;
              auVar111._8_4_ = fVar132 + fVar132;
              auVar111._12_4_ = fVar143 + fVar143;
              auVar78._0_4_ = (float)local_1198._0_4_ * local_1098[0] + fVar153 * local_1088._0_4_;
              auVar78._4_4_ = (float)local_1198._4_4_ * local_1098[1] + fVar157 * local_1088._4_4_;
              auVar78._8_4_ = fStack_1190 * local_1098[2] + fStack_11f0 * local_1088._8_4_;
              auVar78._12_4_ = fStack_118c * local_1098[3] + fStack_11ec * local_1088._12_4_;
              fVar130 = local_ff8 * (float)local_10a8._0_4_ + auVar78._0_4_;
              fVar142 = fStack_ff4 * (float)local_10a8._4_4_ + auVar78._4_4_;
              fVar132 = fStack_ff0 * fStack_10a0 + auVar78._8_4_;
              fVar143 = fStack_fec * fStack_109c + auVar78._12_4_;
              auVar71 = rcpps(auVar78,auVar111);
              fVar116 = auVar71._0_4_;
              fVar83 = auVar71._4_4_;
              fVar156 = auVar71._8_4_;
              fVar84 = auVar71._12_4_;
              local_10b8[0] =
                   ((1.0 - auVar111._0_4_ * fVar116) * fVar116 + fVar116) * (fVar130 + fVar130);
              local_10b8[1] =
                   ((1.0 - auVar111._4_4_ * fVar83) * fVar83 + fVar83) * (fVar142 + fVar142);
              local_10b8[2] =
                   ((1.0 - auVar111._8_4_ * fVar156) * fVar156 + fVar156) * (fVar132 + fVar132);
              local_10b8[3] =
                   ((1.0 - auVar111._12_4_ * fVar84) * fVar84 + fVar84) * (fVar143 + fVar143);
              fVar130 = (ray->super_RayK<1>).tfar;
              fVar142 = (ray->super_RayK<1>).org.field_0.m128[3];
              bVar16 = local_10b8[0] <= fVar130 && fVar142 <= local_10b8[0];
              auVar92._0_4_ = -(uint)bVar16;
              bVar17 = local_10b8[1] <= fVar130 && fVar142 <= local_10b8[1];
              auVar92._4_4_ = -(uint)bVar17;
              bVar15 = local_10b8[2] <= fVar130 && fVar142 <= local_10b8[2];
              auVar92._8_4_ = -(uint)bVar15;
              bVar14 = local_10b8[3] <= fVar130 && fVar142 <= local_10b8[3];
              auVar92._12_4_ = -(uint)bVar14;
              auVar112._0_4_ = (int)((uint)(auVar111._0_4_ != 0.0 && bVar16) * -0x80000000) >> 0x1f;
              auVar112._4_4_ = (int)((uint)(auVar111._4_4_ != 0.0 && bVar17) * -0x80000000) >> 0x1f;
              auVar112._8_4_ = (int)((uint)(auVar111._8_4_ != 0.0 && bVar15) * -0x80000000) >> 0x1f;
              auVar112._12_4_ =
                   (int)((uint)(auVar111._12_4_ != 0.0 && bVar14) * -0x80000000) >> 0x1f;
              auVar113 = auVar112 & auVar159;
              iVar22 = movmskps(iVar22,auVar113);
              if (iVar22 != 0) {
                _fStack_1210 = auVar165._8_8_;
                local_1128._8_4_ = fStack_1210;
                local_1128._12_4_ = fStack_120c;
                local_1128._0_8_ = auVar165._0_8_;
                _fStack_1250 = auVar146._8_8_;
                local_1118 = auVar146._0_8_;
                uStack_1110 = _fStack_1250;
                local_1108 = CONCAT44(fStack_1044,local_1048);
                uStack_1100 = CONCAT44(fStack_103c,fStack_1040);
                local_10f8 = &local_1140;
                local_10e8 = auVar113;
                pGVar10 = (context->scene->geometries).items[uVar23].ptr;
                if ((pGVar10->mask & (ray->super_RayK<1>).mask) != 0) {
                  local_11e8 = auVar113;
                  auVar20._8_8_ = CONCAT44(fStack_103c,fStack_1040);
                  auVar20._0_8_ = CONCAT44(fStack_1044,local_1048);
                  auVar71 = rcpps(auVar92,auVar20);
                  fVar130 = auVar71._0_4_;
                  fVar142 = auVar71._4_4_;
                  fVar132 = auVar71._8_4_;
                  fVar143 = auVar71._12_4_;
                  fVar130 = (float)(-(uint)(1e-18 <= ABS(local_1048)) &
                                   (uint)(((float)DAT_01feca10 - local_1048 * fVar130) * fVar130 +
                                         fVar130));
                  fVar142 = (float)(-(uint)(1e-18 <= ABS(fStack_1044)) &
                                   (uint)((DAT_01feca10._4_4_ - fStack_1044 * fVar142) * fVar142 +
                                         fVar142));
                  fVar132 = (float)(-(uint)(1e-18 <= ABS(fStack_1040)) &
                                   (uint)((DAT_01feca10._8_4_ - fStack_1040 * fVar132) * fVar132 +
                                         fVar132));
                  fVar143 = (float)(-(uint)(1e-18 <= ABS(fStack_103c)) &
                                   (uint)((DAT_01feca10._12_4_ - fStack_103c * fVar143) * fVar143 +
                                         fVar143));
                  auVar79._0_4_ = fVar168 * fVar130;
                  auVar79._4_4_ = fVar169 * fVar142;
                  auVar79._8_4_ = auVar165._8_4_ * fVar132;
                  auVar79._12_4_ = auVar165._12_4_ * fVar143;
                  auVar134 = minps(auVar79,_DAT_01feca10);
                  auVar62._0_4_ = fVar130 * fVar155;
                  auVar62._4_4_ = fVar142 * fVar158;
                  auVar62._8_4_ = fVar132 * auVar146._8_4_;
                  auVar62._12_4_ = fVar143 * auVar146._12_4_;
                  auVar71 = minps(auVar62,_DAT_01feca10);
                  fVar130 = local_1140[1];
                  pfVar6 = local_1140 + uVar27;
                  fVar142 = *pfVar6;
                  fVar132 = pfVar6[1];
                  fVar143 = local_1140[2];
                  fVar116 = pfVar6[2];
                  if (uVar27 == 2) {
                    fVar143 = fVar130;
                    fVar116 = fVar132;
                  }
                  fVar137 = auVar134._0_4_;
                  fVar126 = auVar134._4_4_;
                  fVar138 = auVar134._8_4_;
                  fVar82 = auVar134._12_4_;
                  fVar83 = auVar71._0_4_;
                  fVar156 = auVar71._4_4_;
                  fVar84 = auVar71._8_4_;
                  fVar123 = auVar71._12_4_;
                  fVar85 = (1.0 - fVar137) - fVar83;
                  fVar96 = (1.0 - fVar126) - fVar156;
                  fVar97 = (1.0 - fVar138) - fVar84;
                  fVar144 = (1.0 - fVar82) - fVar123;
                  local_10c8._0_4_ =
                       fVar85 * (float)((uint)*local_1140 >> 0x10) * 0.00012207031 +
                       (float)((uint)fVar142 >> 0x10) * 0.00012207031 * fVar83 +
                       (float)((uint)fVar130 >> 0x10) * 0.00012207031 * fVar137;
                  local_10c8._4_4_ =
                       fVar96 * (float)((uint)fVar142 >> 0x10) * 0.00012207031 +
                       (float)((uint)fVar132 >> 0x10) * 0.00012207031 * fVar156 +
                       (float)((uint)fVar130 >> 0x10) * 0.00012207031 * fVar126;
                  local_10c8._8_4_ =
                       fVar97 * (float)((uint)fVar130 >> 0x10) * 0.00012207031 +
                       (float)((uint)fVar132 >> 0x10) * 0.00012207031 * fVar84 +
                       (float)((uint)fVar143 >> 0x10) * 0.00012207031 * fVar138;
                  local_10c8._12_4_ =
                       fVar144 * (float)((uint)fVar132 >> 0x10) * 0.00012207031 +
                       (float)((uint)fVar116 >> 0x10) * 0.00012207031 * fVar123 +
                       (float)((uint)fVar143 >> 0x10) * 0.00012207031 * fVar82;
                  local_10d8[1] =
                       (float)((uint)fVar142 & 0xffff) * 0.00012207031 * fVar96 +
                       (float)((uint)fVar132 & 0xffff) * 0.00012207031 * fVar156 +
                       (float)((uint)fVar130 & 0xffff) * 0.00012207031 * fVar126;
                  local_10d8[0] =
                       (float)((uint)*local_1140 & 0xffff) * 0.00012207031 * fVar85 +
                       (float)((uint)fVar142 & 0xffff) * 0.00012207031 * fVar83 +
                       (float)((uint)fVar130 & 0xffff) * 0.00012207031 * fVar137;
                  local_10d8[2] =
                       (float)((uint)fVar130 & 0xffff) * 0.00012207031 * fVar97 +
                       (float)((uint)fVar132 & 0xffff) * 0.00012207031 * fVar84 +
                       (float)((uint)fVar143 & 0xffff) * 0.00012207031 * fVar138;
                  local_10d8[3] =
                       (float)((uint)fVar132 & 0xffff) * 0.00012207031 * fVar144 +
                       (float)((uint)fVar116 & 0xffff) * 0.00012207031 * fVar123 +
                       (float)((uint)fVar143 & 0xffff) * 0.00012207031 * fVar82;
                  auVar115._4_4_ = local_10b8[1];
                  auVar115._0_4_ = local_10b8[0];
                  auVar115._8_4_ = local_10b8[2];
                  auVar115._12_4_ = local_10b8[3];
                  auVar134 = ~auVar113 & _DAT_01feb9f0 | auVar115 & auVar113;
                  auVar93._4_4_ = auVar134._0_4_;
                  auVar93._0_4_ = auVar134._4_4_;
                  auVar93._8_4_ = auVar134._12_4_;
                  auVar93._12_4_ = auVar134._8_4_;
                  auVar71 = minps(auVar93,auVar134);
                  auVar63._0_8_ = auVar71._8_8_;
                  auVar63._8_4_ = auVar71._0_4_;
                  auVar63._12_4_ = auVar71._4_4_;
                  auVar71 = minps(auVar63,auVar71);
                  auVar64._0_8_ =
                       CONCAT44(-(uint)(auVar71._4_4_ == auVar134._4_4_) & auVar113._4_4_,
                                -(uint)(auVar71._0_4_ == auVar134._0_4_) & auVar113._0_4_);
                  auVar64._8_4_ = -(uint)(auVar71._8_4_ == auVar134._8_4_) & auVar113._8_4_;
                  auVar64._12_4_ = -(uint)(auVar71._12_4_ == auVar134._12_4_) & auVar113._12_4_;
                  iVar22 = movmskps((int)uVar27,auVar64);
                  if (iVar22 != 0) {
                    auVar113._8_4_ = auVar64._8_4_;
                    auVar113._0_8_ = auVar64._0_8_;
                    auVar113._12_4_ = auVar64._12_4_;
                  }
                  uVar30 = movmskps(iVar22,auVar113);
                  uVar27 = CONCAT44((int)(uVar27 >> 0x20),uVar30);
                  lVar24 = 0;
                  if (uVar27 != 0) {
                    for (; (uVar27 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
                    }
                  }
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar130 = local_10d8[lVar24];
                    fVar142 = local_10b8[lVar24 + -4];
                    fVar132 = local_1098[lVar24 + -4];
                    fVar143 = local_1098[lVar24];
                    fVar116 = *(float *)(local_1088 + lVar24 * 4);
                    (ray->super_RayK<1>).tfar = local_10b8[lVar24];
                    (ray->Ng).field_0.field_0.x = fVar132;
                    (ray->Ng).field_0.field_0.y = fVar143;
                    (ray->Ng).field_0.field_0.z = fVar116;
                    ray->u = fVar130;
                    ray->v = fVar142;
                    ray->primID = uVar38;
                    ray->geomID = uVar36;
                    pRVar11 = context->user;
                    ray->instID[0] = pRVar11->instID[0];
                    ray->instPrimID[0] = pRVar11->instPrimID[0];
                  }
                  else {
                    local_1218 = (undefined1  [8])context->args;
                    local_1258 = (undefined1  [8])context->user;
                    local_11f8 = uVar23;
                    _local_1228 = auVar115;
                    local_1200 = pauVar32;
                    local_119c = uVar38;
                    do {
                      local_116c = local_10d8[lVar24];
                      local_1168 = local_10b8[lVar24 + -4];
                      local_1238._0_4_ = (ray->super_RayK<1>).tfar;
                      (ray->super_RayK<1>).tfar = local_10b8[lVar24];
                      local_1178 = local_1098[lVar24 + -4];
                      local_1174 = local_1098[lVar24];
                      local_1170 = *(undefined4 *)(local_1088 + lVar24 * 4);
                      local_1164 = local_119c;
                      local_1160 = (int)uVar23;
                      local_115c = *(undefined4 *)local_1258;
                      local_1158 = *(undefined4 *)((long)local_1258 + 4);
                      local_125c = (undefined1  [4])0xffffffff;
                      local_11d0.valid = (int *)local_125c;
                      local_11d0.geometryUserPtr = pGVar10->userPtr;
                      local_11d0.context = (RTCRayQueryContext *)local_1258;
                      local_11d0.ray = (RTCRayN *)ray;
                      local_11d0.hit = (RTCHitN *)&local_1178;
                      local_11d0.N = 1;
                      if ((pGVar10->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                         (auVar29 = (undefined1  [8])pGVar10,
                         (*pGVar10->intersectionFilterN)(&local_11d0), pauVar32 = local_1200,
                         uVar23 = local_11f8, auVar115 = _local_1228,
                         (((RayK<1> *)local_11d0.valid)->org).field_0.m128[0] != 0.0)) {
                        if (*(Device **)((long)local_1218 + 0x10) != (Device *)0x0) {
                          auVar29 = local_1218;
                          if ((((ulong)((RefCount *)local_1218)->_vptr_RefCount & 2) != 0) ||
                             (auVar29 = (undefined1  [8])pGVar10,
                             ((pGVar10->field_8).field_0x2 & 0x40) != 0)) {
                            (*(code *)*(Device **)((long)local_1218 + 0x10))(&local_11d0);
                            pauVar32 = local_1200;
                            uVar23 = local_11f8;
                            auVar115 = _local_1228;
                          }
                          if ((((RayK<1> *)local_11d0.valid)->org).field_0.m128[0] == 0.0)
                          goto LAB_00dff03b;
                        }
                        (((Vec3f *)((long)local_11d0.ray + 0x30))->field_0).field_0.x =
                             *(float *)local_11d0.hit;
                        (((Vec3f *)((long)local_11d0.ray + 0x30))->field_0).field_0.y =
                             *(float *)(local_11d0.hit + 4);
                        (((Vec3f *)((long)local_11d0.ray + 0x30))->field_0).field_0.z =
                             *(float *)(local_11d0.hit + 8);
                        *(float *)((long)local_11d0.ray + 0x3c) = *(float *)(local_11d0.hit + 0xc);
                        *(float *)((long)local_11d0.ray + 0x40) = *(float *)(local_11d0.hit + 0x10);
                        *(float *)((long)local_11d0.ray + 0x44) = *(float *)(local_11d0.hit + 0x14);
                        *(float *)((long)local_11d0.ray + 0x48) = *(float *)(local_11d0.hit + 0x18);
                        *(float *)((long)local_11d0.ray + 0x4c) = *(float *)(local_11d0.hit + 0x1c);
                        auVar29 = (undefined1  [8])(ulong)(uint)*(float *)(local_11d0.hit + 0x20);
                        *(float *)((long)local_11d0.ray + 0x50) = *(float *)(local_11d0.hit + 0x20);
                        pRVar25 = (RayHit *)local_11d0.ray;
                      }
                      else {
LAB_00dff03b:
                        (ray->super_RayK<1>).tfar = (float)local_1238;
                        pRVar25 = (RayHit *)local_11d0.valid;
                      }
                      *(undefined4 *)(local_11e8 + lVar24 * 4) = 0;
                      fVar130 = (ray->super_RayK<1>).tfar;
                      auVar53._0_4_ = -(uint)(auVar115._0_4_ <= fVar130) & local_11e8._0_4_;
                      auVar53._4_4_ = -(uint)(auVar115._4_4_ <= fVar130) & local_11e8._4_4_;
                      auVar53._8_4_ = -(uint)(auVar115._8_4_ <= fVar130) & local_11e8._8_4_;
                      auVar53._12_4_ = -(uint)(auVar115._12_4_ <= fVar130) & local_11e8._12_4_;
                      local_11e8 = auVar53;
                      iVar22 = movmskps((int)pRVar25,auVar53);
                      if (iVar22 != 0) {
                        auVar68._0_4_ = auVar53._0_4_ & (uint)auVar115._0_4_;
                        auVar68._4_4_ = auVar53._4_4_ & (uint)auVar115._4_4_;
                        auVar68._8_4_ = auVar53._8_4_ & (uint)auVar115._8_4_;
                        auVar68._12_4_ = auVar53._12_4_ & (uint)auVar115._12_4_;
                        auVar81._0_8_ = CONCAT44(~auVar53._4_4_,~auVar53._0_4_) & 0x7f8000007f800000
                        ;
                        auVar81._8_4_ = ~auVar53._8_4_ & 0x7f800000;
                        auVar81._12_4_ = ~auVar53._12_4_ & 0x7f800000;
                        auVar81 = auVar81 | auVar68;
                        auVar95._4_4_ = auVar81._0_4_;
                        auVar95._0_4_ = auVar81._4_4_;
                        auVar95._8_4_ = auVar81._12_4_;
                        auVar95._12_4_ = auVar81._8_4_;
                        auVar71 = minps(auVar95,auVar81);
                        auVar69._0_8_ = auVar71._8_8_;
                        auVar69._8_4_ = auVar71._0_4_;
                        auVar69._12_4_ = auVar71._4_4_;
                        auVar71 = minps(auVar69,auVar71);
                        auVar70._0_8_ =
                             CONCAT44(-(uint)(auVar71._4_4_ == auVar81._4_4_) & auVar53._4_4_,
                                      -(uint)(auVar71._0_4_ == auVar81._0_4_) & auVar53._0_4_);
                        auVar70._8_4_ = -(uint)(auVar71._8_4_ == auVar81._8_4_) & auVar53._8_4_;
                        auVar70._12_4_ = -(uint)(auVar71._12_4_ == auVar81._12_4_) & auVar53._12_4_;
                        iVar26 = movmskps(SUB84(auVar29,0),auVar70);
                        if (iVar26 != 0) {
                          auVar53._8_4_ = auVar70._8_4_;
                          auVar53._0_8_ = auVar70._0_8_;
                          auVar53._12_4_ = auVar70._12_4_;
                        }
                        uVar30 = movmskps(iVar26,auVar53);
                        uVar27 = CONCAT44((int)((ulong)auVar29 >> 0x20),uVar30);
                        lVar24 = 0;
                        if (uVar27 != 0) {
                          for (; (uVar27 >> lVar24 & 1) == 0; lVar24 = lVar24 + 1) {
                          }
                        }
                      }
                    } while ((char)iVar22 != '\0');
                  }
                }
              }
            }
          }
          lVar24 = 0;
          fVar116 = local_f98;
          fVar130 = fStack_f94;
          fVar142 = fStack_f90;
          fVar83 = fStack_f8c;
          auVar71 = local_fa8;
          fVar156 = local_fc8;
          fVar84 = fStack_fc4;
          fVar123 = fStack_fc0;
          fVar137 = fStack_fbc;
          fVar143 = local_fe8;
          fVar126 = fStack_fe4;
          fVar138 = fStack_fe0;
          fVar82 = fStack_fdc;
          fVar144 = local_1058;
          fVar85 = fStack_1054;
          fVar96 = fStack_1050;
          fVar97 = fStack_104c;
          fVar147 = local_1068;
          fVar98 = fStack_1064;
          fVar103 = fStack_1060;
          fVar104 = fStack_105c;
          fVar152 = local_1028;
          fVar105 = fStack_1024;
          fVar117 = fStack_1020;
          fVar118 = fStack_101c;
          fVar154 = local_1038;
          fVar124 = fStack_1034;
          fVar125 = fStack_1030;
          fVar127 = fStack_102c;
          fVar149 = local_fb8;
          fVar131 = fStack_fb4;
          fVar133 = fStack_fb0;
          fVar136 = fStack_fac;
          fVar132 = local_fd8;
          fVar139 = fStack_fd4;
          fVar140 = fStack_fd0;
          fVar141 = fStack_fcc;
        }
        else {
          local_1240 = uVar23 & 0xfffffffffffffff0;
          lVar24 = *(long *)(local_1240 + 0x30 + (ulong)*(uint *)(local_1240 + 0x2c));
        }
        fVar145 = (ray->super_RayK<1>).tfar;
        auVar134._4_4_ = fVar145;
        auVar134._0_4_ = fVar145;
        auVar134._8_4_ = fVar145;
        auVar134._12_4_ = fVar145;
        if (lVar24 != 0) {
          *(long *)*pauVar32 = lVar24;
          *(undefined4 *)((long)*pauVar32 + 8) = 0;
          pauVar32 = pauVar32 + 1;
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }